

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *
wasm::WATParser::inlineExports
          (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *__return_storage_ptr__,
          Lexer *in)

{
  pointer pNVar1;
  bool bVar2;
  Name *__x;
  basic_string_view<char,_std::char_traits<char>_> expected;
  allocator<char> local_f1;
  string local_f0;
  Err local_d0;
  undefined4 local_b0;
  allocator<char> local_a9;
  string local_a8;
  Err local_88;
  undefined1 local_68 [8];
  optional<wasm::Name> name;
  undefined1 local_30 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> exports;
  Lexer *in_local;
  
  exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_30);
  do {
    pNVar1 = exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    expected = sv("export",6);
    bVar2 = Lexer::takeSExprStart((Lexer *)pNVar1,expected);
    if (!bVar2) {
      Result<std::vector<wasm::Name,std::allocator<wasm::Name>>>::
      Result<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                ((Result<std::vector<wasm::Name,std::allocator<wasm::Name>>> *)
                 __return_storage_ptr__,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_30)
      ;
LAB_0233fa75:
      local_b0 = 1;
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_30);
      return __return_storage_ptr__;
    }
    Lexer::takeName((optional<wasm::Name> *)local_68,
                    (Lexer *)exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_68);
    pNVar1 = exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"expected export name",&local_a9);
      Lexer::err(&local_88,(Lexer *)pNVar1,&local_a8);
      Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::Result
                (__return_storage_ptr__,&local_88);
      wasm::Err::~Err(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      goto LAB_0233fa75;
    }
    bVar2 = Lexer::takeRParen((Lexer *)exports.
                                       super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    pNVar1 = exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"expected end of import",&local_f1);
      Lexer::err(&local_d0,(Lexer *)pNVar1,&local_f0);
      Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::Result
                (__return_storage_ptr__,&local_d0);
      wasm::Err::~Err(&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      goto LAB_0233fa75;
    }
    __x = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_68);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_30,__x);
  } while( true );
}

Assistant:

inline Result<std::vector<Name>> inlineExports(Lexer& in) {
  std::vector<Name> exports;
  while (in.takeSExprStart("export"sv)) {
    auto name = in.takeName();
    if (!name) {
      return in.err("expected export name");
    }
    if (!in.takeRParen()) {
      return in.err("expected end of import");
    }
    exports.push_back(*name);
  }
  return exports;
}